

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O0

strong_ordering
QtOrderingPrivate::
strongOrderingCompareDefaultImpl<Qt::totally_ordered_wrapper<QAbstractItemModel_const*>,Qt::totally_ordered_wrapper<QAbstractItemModel_const*>>
          (totally_ordered_wrapper<const_QAbstractItemModel_*> lhs,
          totally_ordered_wrapper<const_QAbstractItemModel_*> rhs)

{
  long lVar1;
  bool bVar2;
  totally_ordered_wrapper<const_QAbstractItemModel_*> *in_RSI;
  totally_ordered_wrapper<const_QAbstractItemModel_*> *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  CompareUnderlyingType CVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = Qt::operator==<const_QAbstractItemModel_*,_true>(in_RDI,in_RSI);
  if (bVar2) {
    CVar3 = '\0';
  }
  else {
    bVar2 = Qt::operator<<const_QAbstractItemModel_*,_true>
                      ((totally_ordered_wrapper<const_QAbstractItemModel_*> *)
                       CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),in_RDI);
    if (bVar2) {
      CVar3 = -1;
    }
    else {
      CVar3 = '\x01';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (strong_ordering)CVar3;
  }
  __stack_chk_fail();
}

Assistant:

constexpr Qt::strong_ordering
strongOrderingCompareDefaultImpl(T lhs, U rhs) noexcept
{
#ifdef __cpp_lib_three_way_comparison
    return lhs <=> rhs;
#else
    if (lhs == rhs)
        return Qt::strong_ordering::equivalent;
    else if (lhs < rhs)
        return Qt::strong_ordering::less;
    else
        return Qt::strong_ordering::greater;
#endif // __cpp_lib_three_way_comparison
}